

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_util.cpp
# Opt level: O1

void __thiscall
duckdb::HTTPUtil::ParseHTTPProxyHost
          (HTTPUtil *this,string *proxy_value,string *hostname_out,idx_t *port_out,
          idx_t default_port)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer __src;
  bool bVar2;
  int iVar3;
  long lVar4;
  reference pvVar5;
  InvalidInputException *pIVar6;
  uint uVar7;
  undefined1 strict;
  string_t input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  proxy_split;
  idx_t port;
  string sanitized_proxy_value;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  string local_118;
  string *local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f0;
  _Alloc_hider local_d8;
  string local_d0;
  undefined1 *local_b0;
  ulong local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  ulong local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  strict = (undefined1)default_port;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_f8 = hostname_out;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,*(long *)this,*(long *)(this + 8) + *(long *)this);
  local_b0 = local_a0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,*(long *)this,*(long *)(this + 8) + *(long *)this);
  local_90 = local_80;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"http://","");
  if (local_a8 < local_88) {
    bVar2 = false;
  }
  else if (local_88 == 0) {
    bVar2 = true;
  }
  else {
    iVar3 = bcmp(local_90,local_b0,local_88);
    bVar2 = iVar3 == 0;
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (bVar2) {
    ::std::__cxx11::string::substr((ulong)&local_118,(ulong)this);
    ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
  }
  paVar1 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,":","");
  StringUtil::Split(&local_f0,&local_d0,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  lVar4 = (long)local_f0.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_f0.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar4 == 2) {
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](&local_f0,1);
    __src = (pvVar5->_M_dataplus)._M_p;
    uVar7 = (uint)pvVar5->_M_string_length;
    if (uVar7 < 0xd) {
      uStack_11c = 0;
      uStack_124 = 0;
      uStack_120 = 0;
      if (uVar7 != 0) {
        switchD_00b1422a::default(&uStack_124,__src,(ulong)(uVar7 & 0xf));
      }
    }
    else {
      uStack_124 = *(undefined4 *)__src;
      uStack_120 = SUB84(__src,0);
      uStack_11c = (undefined4)((ulong)__src >> 0x20);
    }
    input.value._4_1_ = (undefined1)uStack_11c;
    input.value._5_1_ = uStack_11c._1_1_;
    input.value._6_1_ = uStack_11c._2_1_;
    input.value._7_1_ = uStack_11c._3_1_;
    input.value.pointer.length = uStack_120;
    input.value.pointer.ptr = (char *)&local_d8;
    bVar2 = TryCast::Operation<duckdb::string_t,unsigned_long>
                      ((TryCast *)CONCAT44(uStack_124,uVar7),input,(uint64_t *)0x0,(bool)strict);
    if (!bVar2) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_118._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"Failed to parse port from http_proxy \'%s\'","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)this,*(long *)(this + 8) + *(long *)this);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar6,&local_118,&local_50);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator[](&local_f0,0);
    ::std::__cxx11::string::_M_assign((string *)proxy_value);
    (local_f8->_M_dataplus)._M_p = local_d8._M_p;
  }
  else {
    if (lVar4 != 1) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_118._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"Failed to parse http_proxy \'%s\' into a host and port","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,*(long *)this,*(long *)(this + 8) + *(long *)this);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar6,&local_118,&local_70);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator[](&local_f0,0);
    ::std::__cxx11::string::_M_assign((string *)proxy_value);
    (local_f8->_M_dataplus)._M_p = (pointer)port_out;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HTTPUtil::ParseHTTPProxyHost(string &proxy_value, string &hostname_out, idx_t &port_out, idx_t default_port) {
	auto sanitized_proxy_value = proxy_value;
	if (StringUtil::StartsWith(proxy_value, "http://")) {
		sanitized_proxy_value = proxy_value.substr(7);
	}
	auto proxy_split = StringUtil::Split(sanitized_proxy_value, ":");
	if (proxy_split.size() == 1) {
		hostname_out = proxy_split[0];
		port_out = default_port;
	} else if (proxy_split.size() == 2) {
		idx_t port;
		if (!TryCast::Operation<string_t, idx_t>(proxy_split[1], port, false)) {
			throw InvalidInputException("Failed to parse port from http_proxy '%s'", proxy_value);
		}
		hostname_out = proxy_split[0];
		port_out = port;
	} else {
		throw InvalidInputException("Failed to parse http_proxy '%s' into a host and port", proxy_value);
	}
}